

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

Expression * __thiscall soul::heart::Parser::parseExpression(Parser *this,FunctionParseState *state)

{
  char *pcVar1;
  SourceCodeText *o;
  ProgramImpl *pPVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BinaryOperator *pBVar6;
  UnaryOperator *pUVar7;
  TypeCast *lhs;
  Expression *pEVar8;
  Constant *__return_storage_ptr__;
  Op opType;
  Op opType_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string name;
  pool_ptr<soul::heart::Variable> v;
  CodeLocation errorPos;
  undefined1 local_100 [72];
  CodeLocation local_b8;
  Value local_a8;
  CompileMessage local_68;
  
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"add");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = add;
LAB_0025374c:
    pBVar6 = parseBinaryOp(this,state,opType);
    return &pBVar6->super_Expression;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"subtract");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = subtract;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"multiply");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = multiply;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"divide");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = divide;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"modulo");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = modulo;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"bitwiseOr");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = bitwiseOr;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"bitwiseAnd");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = bitwiseAnd;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"bitwiseXor");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = bitwiseXor;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"logicalOr");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = logicalOr;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"logicalAnd");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = logicalAnd;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"equals");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = equals;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"notEquals");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = notEquals;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"lessThan");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = lessThan;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"lessThanOrEqual");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = lessThanOrEqual;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"greaterThan");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = greaterThan;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"greaterThanOrEqual");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = greaterThanOrEqual;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"leftShift");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = leftShift;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"rightShift");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = rightShift;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"rightShiftUnsigned");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = rightShiftUnsigned;
    goto LAB_0025374c;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"negate");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType_00 = negate;
LAB_002537d5:
    pUVar7 = parseUnaryOp(this,state,opType_00);
    return &pUVar7->super_Expression;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"logicalNot");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType_00 = logicalNot;
    goto LAB_002537d5;
  }
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"bitwiseNot");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType_00 = bitwiseNot;
    goto LAB_002537d5;
  }
  pcVar1 = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).currentType.text;
  if ((pcVar1 == "$variableIdentifier") ||
     ((pcVar1 != (char *)0x0 && (iVar5 = strcmp(pcVar1,"$variableIdentifier"), iVar5 == 0)))) {
    o = (this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ).location.sourceCode.object;
    if (o != (SourceCodeText *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    local_b8.location.data =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    local_b8.sourceCode.object = o;
    readQualifiedVariableIdentifier_abi_cxx11_((string *)local_100,this);
    findVariable((Parser *)(local_100 + 0x40),(FunctionParseState *)this,(string *)state);
    if ((Expression *)local_100._64_8_ != (Expression *)0x0) {
      pEVar8 = parseSuffixOperators(this,state,(Expression *)local_100._64_8_);
      if ((undefined1 *)CONCAT71(local_100._1_7_,local_100[0]) != local_100 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_100._1_7_,local_100[0]),
                        CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
      return pEVar8;
    }
    CompileMessageHelpers::createMessage<std::__cxx11::string&>
              (&local_68,(CompileMessageHelpers *)0x1,none,0x2ac591,local_100,in_R9);
    CodeLocation::throwError(&local_b8,&local_68);
  }
  if ((pcVar1 != "$identifier") &&
     ((pcVar1 == (char *)0x0 || (iVar5 = strcmp(pcVar1,"$identifier"), iVar5 != 0))))
  goto LAB_002539a8;
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"cast");
  if (bVar3) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    lhs = parseCast(this,state);
    pEVar8 = parseSuffixOperators(this,state,&lhs->super_Expression);
    return pEVar8;
  }
  __return_storage_ptr__ = (Constant *)local_100;
  parseNaNandInfinityTokens((Value *)__return_storage_ptr__,this);
  if (local_100[0] == invalid) {
    bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"processor");
    bVar3 = true;
    if ((bVar4) &&
       (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ), bVar4)) {
      __return_storage_ptr__ = (Constant *)parseProcessorProperty(this);
      goto LAB_0025395e;
    }
  }
  else {
    pPVar2 = (this->program).pimpl;
    soul::Value::Value(&local_a8,(Value *)local_100);
    __return_storage_ptr__ = Allocator::allocateConstant(&pPVar2->allocator,&local_a8);
    soul::Value::~Value(&local_a8);
LAB_0025395e:
    bVar3 = false;
  }
  soul::Value::~Value((Value *)local_100);
  if (!bVar3) {
    return &__return_storage_ptr__->super_Expression;
  }
LAB_002539a8:
  pcVar1 = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).currentType.text;
  if ((pcVar1 == "$integer32") ||
     ((pcVar1 != (char *)0x0 && (iVar5 = strcmp(pcVar1,"$integer32"), iVar5 == 0)))) {
    local_100[0] = primitive;
    local_100[1] = invalid;
    local_100[2] = false;
    local_100[3] = false;
    local_100._4_4_ = int32;
    local_100[8] = 0;
    local_100._9_7_ = 0;
    local_100[0x10] = '\0';
    local_100._17_7_ = 0;
    pEVar8 = parseConstantAsExpression(this,state,(Type *)local_100);
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)CONCAT71(local_100._17_7_,local_100[0x10]));
  }
  else if ((pcVar1 == "$integer64") ||
          ((pcVar1 != (char *)0x0 && (iVar5 = strcmp(pcVar1,"$integer64"), iVar5 == 0)))) {
    local_100[0] = primitive;
    local_100[1] = invalid;
    local_100[2] = false;
    local_100[3] = false;
    local_100._4_4_ = int64;
    local_100[8] = 0;
    local_100._9_7_ = 0;
    local_100[0x10] = '\0';
    local_100._17_7_ = 0;
    pEVar8 = parseConstantAsExpression(this,state,(Type *)local_100);
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)CONCAT71(local_100._17_7_,local_100[0x10]));
  }
  else if ((pcVar1 == "$float32") ||
          ((pcVar1 != (char *)0x0 && (iVar5 = strcmp(pcVar1,"$float32"), iVar5 == 0)))) {
    local_100[0] = primitive;
    local_100[1] = invalid;
    local_100[2] = false;
    local_100[3] = false;
    local_100._4_4_ = float32;
    local_100[8] = 0;
    local_100._9_7_ = 0;
    local_100[0x10] = '\0';
    local_100._17_7_ = 0;
    pEVar8 = parseConstantAsExpression(this,state,(Type *)local_100);
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)CONCAT71(local_100._17_7_,local_100[0x10]));
  }
  else if ((pcVar1 == "$float64") ||
          ((pcVar1 != (char *)0x0 && (iVar5 = strcmp(pcVar1,"$float64"), iVar5 == 0)))) {
    local_100[0] = primitive;
    local_100[1] = invalid;
    local_100[2] = false;
    local_100[3] = false;
    local_100._4_4_ = float64;
    local_100[8] = 0;
    local_100._9_7_ = 0;
    local_100[0x10] = '\0';
    local_100._17_7_ = 0;
    pEVar8 = parseConstantAsExpression(this,state,(Type *)local_100);
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)CONCAT71(local_100._17_7_,local_100[0x10]));
  }
  else if ((pcVar1 == "$string literal") ||
          ((pcVar1 != (char *)0x0 && (iVar5 = strcmp(pcVar1,"$string literal"), iVar5 == 0)))) {
    local_100[0] = stringLiteral;
    local_100[1] = invalid;
    local_100[2] = false;
    local_100[3] = false;
    local_100._4_4_ = invalid;
    local_100[8] = 0;
    local_100._9_7_ = 0;
    local_100[0x10] = '\0';
    local_100._17_7_ = 0;
    pEVar8 = parseConstantAsExpression(this,state,(Type *)local_100);
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)CONCAT71(local_100._17_7_,local_100[0x10]));
  }
  else {
    readValueType((Type *)local_100,this);
    pEVar8 = parseConstantAsExpression(this,state,(Type *)local_100);
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)CONCAT71(local_100._17_7_,local_100[0x10]));
  }
  return pEVar8;
}

Assistant:

heart::Expression& parseExpression (const FunctionParseState& state)
    {
        #define SOUL_MATCH_BINARY_OP_NAME(name, op) \
            if (matchIf (#name)) return parseBinaryOp (state, BinaryOp::Op::name);
        SOUL_BINARY_OPS (SOUL_MATCH_BINARY_OP_NAME)
        #undef SOUL_MATCH_BINARY_OP_NAME

        #define SOUL_COMPARE_UNARY_OP(name, op) \
            if (matchIf (#name)) return parseUnaryOp (state, UnaryOp::Op::name);
        SOUL_UNARY_OPS (SOUL_COMPARE_UNARY_OP)
        #undef SOUL_COMPARE_UNARY_OP

        if (matches (Token::variableIdentifier))
        {
            auto errorPos = location;
            auto name = readQualifiedVariableIdentifier();

            if (auto v = findVariable (state, name))
                return parseSuffixOperators (state, *v);

            errorPos.throwError (Errors::unresolvedSymbol (name));
        }

        if (matches (Token::identifier))
        {
            if (matchIf ("cast"))
                return parseSuffixOperators (state, parseCast (state));

            auto infOrNaN = parseNaNandInfinityTokens();

            if (infOrNaN.isValid())
                return program.getAllocator().allocateConstant (infOrNaN);

            if (matchIf ("processor"))
                return parseProcessorProperty();
        }

        if (matches (Token::literalInt32))       return parseConstantAsExpression (state, PrimitiveType::int32);
        if (matches (Token::literalInt64))       return parseConstantAsExpression (state, PrimitiveType::int64);
        if (matches (Token::literalFloat32))     return parseConstantAsExpression (state, PrimitiveType::float32);
        if (matches (Token::literalFloat64))     return parseConstantAsExpression (state, PrimitiveType::float64);
        if (matches (Token::literalString))      return parseConstantAsExpression (state, Type::createStringLiteral());

        return parseConstantAsExpression (state, readValueType());
    }